

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pockle.c
# Opt level: O3

void pockle_free(Pockle *pockle)

{
  int iVar1;
  
  pockle_release(pockle,0);
  iVar1 = count234(pockle->tree);
  if (iVar1 == 0) {
    freetree234(pockle->tree);
    safefree(pockle->list);
    safefree(pockle);
    return;
  }
  __assert_fail("count234(pockle->tree) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/keygen/pockle.c",
                0x34,"void pockle_free(Pockle *)");
}

Assistant:

void pockle_free(Pockle *pockle)
{
    pockle_release(pockle, 0);
    assert(count234(pockle->tree) == 0);
    freetree234(pockle->tree);
    sfree(pockle->list);
    sfree(pockle);
}